

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_drawing.cpp
# Opt level: O0

void CGL::Misc::draw_sphere_opengl(Vector3D *p,double r)

{
  char cVar1;
  double in_stack_000000d8;
  Vector3D *in_stack_000000e0;
  
  cVar1 = glIsEnabled(0xb50);
  if (cVar1 == '\0') {
    draw_sphere(in_stack_000000e0,in_stack_000000d8);
  }
  else {
    glDisable(0xb50);
    draw_sphere(in_stack_000000e0,in_stack_000000d8);
    glEnable(0xb50);
  }
  return;
}

Assistant:

void draw_sphere_opengl(const Vector3D& p, double r) {
  if (glIsEnabled(GL_LIGHTING)) {
      glDisable(GL_LIGHTING);
      draw_sphere(p, r);
      glEnable(GL_LIGHTING);
  } else {
    draw_sphere(p, r);
  }
}